

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O0

FString __thiscall Stat_wallcycles::GetStats(Stat_wallcycles *this)

{
  double dVar1;
  double cycles;
  Stat_wallcycles *this_local;
  FString *out;
  
  FString::FString((FString *)this);
  dVar1 = cycle_t::Time(&WallCycles);
  if (((dVar1 != 0.0) || (NAN(dVar1))) && (dVar1 < bestwallcycles)) {
    bestwallcycles = dVar1;
  }
  FString::Format((FString *)this,"%g",bestwallcycles);
  return (FString)(char *)this;
}

Assistant:

ADD_STAT (wallcycles)
{
	FString out;
	double cycles = WallCycles.Time();
	if (cycles && cycles < bestwallcycles)
		bestwallcycles = cycles;
	out.Format ("%g", bestwallcycles);
	return out;
}